

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu.cpp
# Opt level: O1

int __thiscall geemuboi::core::CPU::dec_e(CPU *this)

{
  uint8_t *puVar1;
  byte bVar2;
  Registers *pRVar3;
  uint8_t uVar4;
  
  pRVar3 = this->regs;
  bVar2 = pRVar3->f;
  pRVar3->f = (bVar2 & 0x10) + 0x40;
  if ((pRVar3->e & 0xf) == 0) {
    pRVar3->f = bVar2 & 0x10 | 0x60;
  }
  uVar4 = pRVar3->e - 1;
  pRVar3->e = uVar4;
  if (uVar4 == '\0') {
    puVar1 = &this->regs->f;
    *puVar1 = *puVar1 | 0x80;
  }
  return 1;
}

Assistant:

int CPU::dec_e() {
    dec_r8(regs.e);
    return 1;
}